

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode Subscription_registerPublishJob(UA_Server *server,UA_Subscription *sub)

{
  UA_Job job_00;
  uint local_88;
  uint local_80;
  uint local_7c;
  UA_StatusCode retval;
  UA_Job job;
  UA_Subscription *sub_local;
  UA_Server *server_local;
  
  if ((sub->publishJobIsRegistered & 1U) == 0) {
    if (sub->session->channel == (UA_SecureChannel *)0x0) {
      local_80 = 0;
    }
    else {
      if (sub->session->channel->connection == (UA_Connection *)0x0) {
        local_7c = 0;
      }
      else {
        local_7c = sub->session->channel->connection->sockfd;
      }
      local_80 = local_7c;
    }
    if (sub->session->channel == (UA_SecureChannel *)0x0) {
      local_88 = 0;
    }
    else {
      local_88 = (sub->session->channel->securityToken).channelId;
    }
    UA_LOG_DEBUG((server->config).logger,UA_LOGCATEGORY_SESSION,
                 "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Subscription %u | Register subscription publishing callback"
                 ,(ulong)local_80,(ulong)local_88,
                 (ulong)(sub->session->sessionId).identifier.numeric);
    job_00._4_4_ = retval;
    job_00.type = 4;
    job_00.job._0_4_ = (int)sub;
    job_00.job._4_4_ = (int)((ulong)sub >> 0x20);
    job_00.job.binaryMessage.message.length._0_4_ = 0x134f60;
    job_00.job.binaryMessage.message.length._4_4_ = 0;
    job_00.job._16_4_ = (int)job.job.binaryMessage.message.length;
    job_00.job._20_4_ = (int)((ulong)job.job._8_8_ >> 0x20);
    server_local._4_4_ =
         UA_Server_addRepeatedJob
                   (server,job_00,(UA_UInt32)(long)sub->publishingInterval,&sub->publishJobGuid);
    if (server_local._4_4_ == 0) {
      sub->publishJobIsRegistered = true;
    }
  }
  else {
    server_local._4_4_ = 0;
  }
  return server_local._4_4_;
}

Assistant:

UA_StatusCode
Subscription_registerPublishJob(UA_Server *server, UA_Subscription *sub) {
    if(sub->publishJobIsRegistered)
        return UA_STATUSCODE_GOOD;

    UA_LOG_DEBUG_SESSION(server->config.logger, sub->session,
                         "Subscription %u | Register subscription publishing callback",
                         sub->subscriptionID);
    UA_Job job;
    job.type = UA_JOBTYPE_METHODCALL;
    job.job.methodCall.method = (UA_ServerCallback)UA_Subscription_publishCallback;
    job.job.methodCall.data = sub;
    UA_StatusCode retval =
        UA_Server_addRepeatedJob(server, job, (UA_UInt32)sub->publishingInterval,
                                 &sub->publishJobGuid);
    if(retval == UA_STATUSCODE_GOOD)
        sub->publishJobIsRegistered = true;
    return retval;
}